

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void prepare_horizontal_filter_coeff_alpha0_avx2(int beta,int sx,__m256i *coeff)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*in_RDX) [32];
  int in_ESI;
  int in_EDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m256i res_0;
  __m128i tmp_1;
  __m128i tmp_0;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  
  auVar9._8_8_ = 0;
  auVar9._0_8_ = av1_filter_8bit[in_ESI >> 10];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = av1_filter_8bit[in_ESI + in_EDI >> 10];
  auVar9 = ZEXT116(0) * auVar10 + ZEXT116(1) * auVar9;
  auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
  uStack_1f0 = auVar10._0_8_;
  uStack_1e8 = auVar10._8_8_;
  auVar8._16_8_ = uStack_1f0;
  auVar8._0_16_ = auVar9;
  auVar8._24_8_ = uStack_1e8;
  auVar7[8] = '\0';
  auVar7[9] = '\x01';
  auVar7[10] = '\0';
  auVar7[0xb] = '\x01';
  auVar7[0xc] = '\0';
  auVar7[0xd] = '\x01';
  auVar7[0xe] = '\0';
  auVar7[0xf] = '\x01';
  auVar7[0] = '\0';
  auVar7[1] = '\x01';
  auVar7[2] = '\0';
  auVar7[3] = '\x01';
  auVar7[4] = '\0';
  auVar7[5] = '\x01';
  auVar7[6] = '\0';
  auVar7[7] = '\x01';
  auVar7[0x10] = '\0';
  auVar7[0x11] = '\x01';
  auVar7[0x12] = '\0';
  auVar7[0x13] = '\x01';
  auVar7[0x14] = '\0';
  auVar7[0x15] = '\x01';
  auVar7[0x16] = '\0';
  auVar7[0x17] = '\x01';
  auVar7[0x18] = '\0';
  auVar7[0x19] = '\x01';
  auVar7[0x1a] = '\0';
  auVar7[0x1b] = '\x01';
  auVar7[0x1c] = '\0';
  auVar7[0x1d] = '\x01';
  auVar7[0x1e] = '\0';
  auVar7[0x1f] = '\x01';
  auVar1 = vpshufb_avx2(auVar8,auVar7);
  *in_RDX = auVar1;
  auVar6._16_8_ = uStack_1f0;
  auVar6._0_16_ = auVar9;
  auVar6._24_8_ = uStack_1e8;
  auVar5[8] = '\x02';
  auVar5[9] = '\x03';
  auVar5[10] = '\x02';
  auVar5[0xb] = '\x03';
  auVar5[0xc] = '\x02';
  auVar5[0xd] = '\x03';
  auVar5[0xe] = '\x02';
  auVar5[0xf] = '\x03';
  auVar5[0] = '\x02';
  auVar5[1] = '\x03';
  auVar5[2] = '\x02';
  auVar5[3] = '\x03';
  auVar5[4] = '\x02';
  auVar5[5] = '\x03';
  auVar5[6] = '\x02';
  auVar5[7] = '\x03';
  auVar5[0x10] = '\x02';
  auVar5[0x11] = '\x03';
  auVar5[0x12] = '\x02';
  auVar5[0x13] = '\x03';
  auVar5[0x14] = '\x02';
  auVar5[0x15] = '\x03';
  auVar5[0x16] = '\x02';
  auVar5[0x17] = '\x03';
  auVar5[0x18] = '\x02';
  auVar5[0x19] = '\x03';
  auVar5[0x1a] = '\x02';
  auVar5[0x1b] = '\x03';
  auVar5[0x1c] = '\x02';
  auVar5[0x1d] = '\x03';
  auVar5[0x1e] = '\x02';
  auVar5[0x1f] = '\x03';
  auVar1 = vpshufb_avx2(auVar6,auVar5);
  in_RDX[1] = auVar1;
  auVar4._16_8_ = uStack_1f0;
  auVar4._0_16_ = auVar9;
  auVar4._24_8_ = uStack_1e8;
  auVar3[8] = '\x04';
  auVar3[9] = '\x05';
  auVar3[10] = '\x04';
  auVar3[0xb] = '\x05';
  auVar3[0xc] = '\x04';
  auVar3[0xd] = '\x05';
  auVar3[0xe] = '\x04';
  auVar3[0xf] = '\x05';
  auVar3[0] = '\x04';
  auVar3[1] = '\x05';
  auVar3[2] = '\x04';
  auVar3[3] = '\x05';
  auVar3[4] = '\x04';
  auVar3[5] = '\x05';
  auVar3[6] = '\x04';
  auVar3[7] = '\x05';
  auVar3[0x10] = '\x04';
  auVar3[0x11] = '\x05';
  auVar3[0x12] = '\x04';
  auVar3[0x13] = '\x05';
  auVar3[0x14] = '\x04';
  auVar3[0x15] = '\x05';
  auVar3[0x16] = '\x04';
  auVar3[0x17] = '\x05';
  auVar3[0x18] = '\x04';
  auVar3[0x19] = '\x05';
  auVar3[0x1a] = '\x04';
  auVar3[0x1b] = '\x05';
  auVar3[0x1c] = '\x04';
  auVar3[0x1d] = '\x05';
  auVar3[0x1e] = '\x04';
  auVar3[0x1f] = '\x05';
  auVar1 = vpshufb_avx2(auVar4,auVar3);
  in_RDX[2] = auVar1;
  auVar2._16_8_ = uStack_1f0;
  auVar2._0_16_ = auVar9;
  auVar2._24_8_ = uStack_1e8;
  auVar1[8] = '\x06';
  auVar1[9] = '\a';
  auVar1[10] = '\x06';
  auVar1[0xb] = '\a';
  auVar1[0xc] = '\x06';
  auVar1[0xd] = '\a';
  auVar1[0xe] = '\x06';
  auVar1[0xf] = '\a';
  auVar1[0] = '\x06';
  auVar1[1] = '\a';
  auVar1[2] = '\x06';
  auVar1[3] = '\a';
  auVar1[4] = '\x06';
  auVar1[5] = '\a';
  auVar1[6] = '\x06';
  auVar1[7] = '\a';
  auVar1[0x10] = '\x06';
  auVar1[0x11] = '\a';
  auVar1[0x12] = '\x06';
  auVar1[0x13] = '\a';
  auVar1[0x14] = '\x06';
  auVar1[0x15] = '\a';
  auVar1[0x16] = '\x06';
  auVar1[0x17] = '\a';
  auVar1[0x18] = '\x06';
  auVar1[0x19] = '\a';
  auVar1[0x1a] = '\x06';
  auVar1[0x1b] = '\a';
  auVar1[0x1c] = '\x06';
  auVar1[0x1d] = '\a';
  auVar1[0x1e] = '\x06';
  auVar1[0x1f] = '\a';
  auVar1 = vpshufb_avx2(auVar2,auVar1);
  in_RDX[3] = auVar1;
  return;
}

Assistant:

static inline void prepare_horizontal_filter_coeff_alpha0_avx2(int beta, int sx,
                                                               __m256i *coeff) {
  const __m128i tmp_0 =
      _mm_loadl_epi64((__m128i *)&av1_filter_8bit[sx >> WARPEDDIFF_PREC_BITS]);
  const __m128i tmp_1 = _mm_loadl_epi64(
      (__m128i *)&av1_filter_8bit[(sx + beta) >> WARPEDDIFF_PREC_BITS]);

  const __m256i res_0 =
      _mm256_inserti128_si256(_mm256_castsi128_si256(tmp_0), tmp_1, 0x1);

  coeff[0] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_alpha0_mask01_avx2));
  coeff[1] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_alpha0_mask23_avx2));
  coeff[2] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_alpha0_mask45_avx2));
  coeff[3] = _mm256_shuffle_epi8(
      res_0, _mm256_load_si256((__m256i *)shuffle_alpha0_mask67_avx2));
}